

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisForceTorqueContactSensor.cpp
# Opt level: O3

ThreeAxisForceTorqueContactSensor * __thiscall
iDynTree::ThreeAxisForceTorqueContactSensor::computeCenterOfPressureFromLoadCellMeasurements
          (ThreeAxisForceTorqueContactSensor *this,VectorDynSize *loadCellMeasurements)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  double *pdVar6;
  ulong uVar7;
  VectorDynSize *in_RDX;
  char *pcVar8;
  Position *zeroVec;
  ulong uVar9;
  ThreeAxisForceTorqueContactSensor TVar10;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  lVar5 = iDynTree::VectorDynSize::size();
  if (lVar5 == (*(long *)(*(long *)(loadCellMeasurements + 8) + 0xb0) -
                *(long *)(*(long *)(loadCellMeasurements + 8) + 0xa8) >> 3) * -0x5555555555555555) {
    lVar5 = iDynTree::VectorDynSize::size();
    if (lVar5 != 0) {
      local_48 = 0.0;
      dStack_40 = 0.0;
      lVar5 = 0x10;
      uVar9 = 0;
      local_58 = 0.0;
      dStack_50 = 0.0;
      do {
        pdVar6 = (double *)iDynTree::VectorDynSize::operator()(in_RDX,uVar9);
        dVar1 = *pdVar6;
        pdVar6 = (double *)iDynTree::VectorDynSize::operator()(in_RDX,uVar9);
        dVar2 = *pdVar6;
        pdVar6 = (double *)(*(long *)(*(long *)(loadCellMeasurements + 8) + 0xa8) + -0x10 + lVar5);
        local_48 = local_48 + *pdVar6 * dVar2;
        dStack_40 = dStack_40 + pdVar6[1] * dVar2;
        local_58 = local_58 + dVar1;
        dStack_50 = dStack_50 +
                    dVar2 * *(double *)
                             (*(long *)(*(long *)(loadCellMeasurements + 8) + 0xa8) + lVar5);
        uVar9 = uVar9 + 1;
        uVar7 = iDynTree::VectorDynSize::size();
        lVar5 = lVar5 + 0x18;
      } while (uVar9 < uVar7);
      if (1e-09 <= local_58) {
        iDynTree::Position::Position((Position *)this);
        auVar4._8_8_ = dStack_40;
        auVar4._0_8_ = local_48;
        auVar3._8_8_ = local_58;
        auVar3._0_8_ = local_58;
        TVar10 = (ThreeAxisForceTorqueContactSensor)divpd(auVar4,auVar3);
        *this = TVar10;
        this[1].super_LinkSensor.super_Sensor._vptr_Sensor = (_func_int **)(dStack_50 / local_58);
        return this;
      }
    }
    pcVar8 = "loadCellMeasurements sum is less than 1e-9";
  }
  else {
    pcVar8 = "loadCellMeasurements has the wrong size";
  }
  iDynTree::reportError
            ("ThreeAxisForceTorqueContactSensor",
             "computeThreeAxisForceTorqueFromLoadCellMeasurements",pcVar8);
  iDynTree::Position::Position((Position *)this);
  (this->super_LinkSensor).super_Sensor._vptr_Sensor = (_func_int **)0x0;
  this->pimpl = (ThreeAxisForceTorqueContactSensorPrivateAttributes *)0x0;
  this[1].super_LinkSensor.super_Sensor._vptr_Sensor = (_func_int **)0x0;
  return this;
}

Assistant:

Position ThreeAxisForceTorqueContactSensor::computeCenterOfPressureFromLoadCellMeasurements(VectorDynSize& loadCellMeasurements) const
{
    if (loadCellMeasurements.size() != pimpl->m_loadCellLocations.size())
    {
        reportError("ThreeAxisForceTorqueContactSensor","computeThreeAxisForceTorqueFromLoadCellMeasurements", "loadCellMeasurements has the wrong size");
        Position zeroVec; zeroVec.zero();
        return zeroVec;
    }

    // We assume that the location of the load cells is on the XY plane. In this case, the cop is just the average of the locations weighted on the measurements
    double sumOfMeasurementsInN=0.0;
    Vector3 weightedSumOfLocations; weightedSumOfLocations.zero();
    for (size_t i=0; i < loadCellMeasurements.size(); i++)
    {
        sumOfMeasurementsInN += loadCellMeasurements(i);
        toEigen(weightedSumOfLocations) += loadCellMeasurements(i)*toEigen(pimpl->m_loadCellLocations[i]);
    }

    if (sumOfMeasurementsInN < 1e-9)
    {
        reportError("ThreeAxisForceTorqueContactSensor","computeThreeAxisForceTorqueFromLoadCellMeasurements", "loadCellMeasurements sum is less than 1e-9");
        Position zeroVec; zeroVec.zero();
        return zeroVec;
    }

    Position ret;
    toEigen(ret) = toEigen(weightedSumOfLocations)/sumOfMeasurementsInN;
    return ret;
}